

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# componententity.cpp
# Opt level: O3

bool __thiscall
libcellml::ComponentEntity::removeComponent
          (ComponentEntity *this,ComponentPtr *component,bool searchEncapsulated)

{
  EntityImpl *pEVar1;
  bool bVar2;
  const_iterator __position;
  ComponentImpl *this_00;
  ulong uVar3;
  bool bVar4;
  ComponentEntity local_38;
  
  __position = ComponentEntityImpl::findComponent
                         ((ComponentEntityImpl *)
                          (this->super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl,
                          component);
  pEVar1 = (this->super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl;
  if (__position._M_current ==
      *(shared_ptr<libcellml::Component> **)((long)&pEVar1[2].mId.field_2 + 8)) {
    if ((searchEncapsulated) &&
       (__position._M_current !=
        (shared_ptr<libcellml::Component> *)pEVar1[2].mId.field_2._M_allocated_capacity)) {
      uVar3 = 1;
      do {
        ComponentEntity::component(&local_38,(size_t)this);
        bVar2 = removeComponent((ComponentEntity *)
                                local_38.super_NamedEntity.super_ParentedEntity.super_Entity.
                                _vptr_Entity,component,true);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            local_38.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_38.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl);
        }
        pEVar1 = (this->super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl;
        bVar4 = uVar3 < (ulong)((long)(*(long *)((long)&pEVar1[2].mId.field_2 + 8) -
                                      pEVar1[2].mId.field_2._M_allocated_capacity) >> 4);
        uVar3 = uVar3 + 1;
      } while (bVar4 && !bVar2);
    }
    else {
      bVar2 = false;
    }
  }
  else {
    this_00 = Component::pFunc((component->
                               super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>)
                               ._M_ptr);
    ParentedEntity::ParentedEntityImpl::removeParent((ParentedEntityImpl *)this_00);
    std::
    vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
    ::_M_erase((vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
                *)&(this->super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl[2].mId.field_2
               ,(iterator)__position._M_current);
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool ComponentEntity::removeComponent(const ComponentPtr &component, bool searchEncapsulated)
{
    bool status = false;
    auto result = pFunc()->findComponent(component);
    if (result != pFunc()->mComponents.end()) {
        component->pFunc()->removeParent();
        pFunc()->mComponents.erase(result);
        status = true;
    } else if (searchEncapsulated) {
        for (size_t i = 0; i < componentCount() && !status; ++i) {
            status = ComponentEntity::component(i)->removeComponent(component, searchEncapsulated);
        }
    }

    return status;
}